

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O0

void duckdb_brotli::BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command *commands,
               size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  uint *in_RCX;
  ulong uVar15;
  long in_RDX;
  ulong uVar16;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  int *piVar17;
  long in_R9;
  size_t max_backward_limit;
  size_t stream_offset;
  uint32_t modifier;
  uint32_t short_code;
  uint32_t delta;
  size_t nbits;
  size_t offset_1;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  uint32_t nbits_2;
  uint32_t offset_2;
  uint16_t bits64;
  uint local_22c;
  ulong local_228;
  ulong local_1f8;
  long local_1d8;
  uint local_1cc;
  long local_1c8;
  size_t dist_code;
  int is_dictionary;
  size_t dictionary_start;
  size_t len_code;
  size_t distance;
  size_t insert_length;
  size_t copy_length;
  ZopfliNode *next;
  size_t gap;
  size_t i;
  uint32_t offset;
  size_t pos;
  
  lVar3 = *(long *)(in_R9 + 0x10);
  uVar8 = (1L << ((byte)*(undefined4 *)(in_R9 + 8) & 0x3f)) - 0x10;
  local_1c8 = 0;
  local_1cc = *(uint *)(in_RDX + 0xc);
  lVar4 = *(long *)(in_R9 + 0x60);
  local_1d8 = 0;
  while (local_1cc != 0xffffffff) {
    puVar9 = (uint *)(in_RDX + (local_1c8 + (ulong)local_1cc) * 0x10);
    uVar7 = *puVar9 & 0x1ffffff;
    local_1f8 = (ulong)(puVar9[2] & 0x7ffffff);
    local_1c8 = local_1f8 + local_1c8;
    local_1cc = puVar9[3];
    if (local_1d8 == 0) {
      local_1f8 = *in_R8 + local_1f8;
      *in_R8 = 0;
    }
    uVar1 = puVar9[1];
    uVar15 = in_RSI + local_1c8 + lVar3;
    local_228 = uVar8;
    if (uVar15 < uVar8) {
      local_228 = uVar15;
    }
    if (puVar9[2] >> 0x1b == 0) {
      local_22c = puVar9[1] + 0xf;
    }
    else {
      local_22c = (puVar9[2] >> 0x1b) - 1;
    }
    uVar15 = (ulong)local_22c;
    piVar17 = (int *)(stream_offset + local_1d8 * 0x10);
    iVar13 = (((*puVar9 & 0x1ffffff) + 9) - (*puVar9 >> 0x19)) - uVar7;
    iVar14 = (int)local_1f8;
    *piVar17 = iVar14;
    piVar17[1] = uVar7 | iVar13 * 0x2000000;
    uVar2 = *(uint *)(in_R9 + 0x3c);
    if (uVar15 < (ulong)uVar2 + 0x10) {
      *(ushort *)((long)piVar17 + 0xe) = (ushort)local_22c;
      piVar17[2] = 0;
    }
    else {
      bVar6 = (byte)*(uint *)(in_R9 + 0x38);
      uVar16 = (1L << (bVar6 + 2 & 0x3f)) + ((uVar15 - 0x10) - (ulong)uVar2);
      iVar5 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      bVar12 = (byte)(iVar5 - 1U);
      uVar10 = uVar16 >> (bVar12 & 0x3f) & 1;
      lVar11 = (ulong)(iVar5 - 1U) - (ulong)*(uint *)(in_R9 + 0x38);
      *(ushort *)((long)piVar17 + 0xe) =
           (short)lVar11 * 0x400 |
           (short)uVar2 + 0x10 + (short)((lVar11 + -1) * 2 + uVar10 << (bVar6 & 0x3f)) +
           ((ushort)uVar16 & (short)(1 << (bVar6 & 0x1f)) - 1U);
      piVar17[2] = (int)(uVar16 - (uVar10 + 2 << (bVar12 & 0x3f)) >> (bVar6 & 0x3f));
    }
    iVar13 = uVar7 + iVar13;
    uVar16 = (ulong)iVar13;
    if (local_1f8 < 6) {
      is_dictionary._2_2_ = (ushort)local_1f8;
    }
    else if (local_1f8 < 0x82) {
      iVar5 = 0x1f;
      if (iVar14 - 2U != 0) {
        for (; iVar14 - 2U >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      is_dictionary._2_2_ =
           (short)(iVar5 + -1) * 2 + (short)(local_1f8 - 2 >> ((byte)(iVar5 + -1) & 0x3f)) + 2;
    }
    else if (local_1f8 < 0x842) {
      iVar5 = 0x1f;
      if (iVar14 - 0x42U != 0) {
        for (; iVar14 - 0x42U >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      is_dictionary._2_2_ = (short)iVar5 + 10;
    }
    else if (local_1f8 < 0x1842) {
      is_dictionary._2_2_ = 0x15;
    }
    else if (local_1f8 < 0x5842) {
      is_dictionary._2_2_ = 0x16;
    }
    else {
      is_dictionary._2_2_ = 0x17;
    }
    if (uVar16 < 10) {
      copy_length._6_2_ = (short)iVar13 - 2;
    }
    else if (uVar16 < 0x86) {
      iVar14 = 0x1f;
      if (iVar13 - 6U != 0) {
        for (; iVar13 - 6U >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      copy_length._6_2_ =
           (short)(iVar14 + -1) * 2 + (short)(uVar16 - 6 >> ((byte)(iVar14 + -1) & 0x3f)) + 4;
    }
    else if (uVar16 < 0x846) {
      iVar14 = 0x1f;
      if (iVar13 - 0x46U != 0) {
        for (; iVar13 - 0x46U >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      copy_length._6_2_ = (short)iVar14 + 0xc;
    }
    else {
      copy_length._6_2_ = 0x17;
    }
    pos._6_2_ = copy_length._6_2_ & 7 | (is_dictionary._2_2_ & 7) << 3;
    if ((((*(ushort *)((long)piVar17 + 0xe) & 0x3ff) == 0) && (is_dictionary._2_2_ < 8)) &&
       (copy_length._6_2_ < 0x10)) {
      if (7 < copy_length._6_2_) {
        pos._6_2_ = pos._6_2_ | 0x40;
      }
    }
    else {
      iVar13 = ((int)(uint)copy_length._6_2_ >> 3) + ((int)(uint)is_dictionary._2_2_ >> 3) * 3;
      pos._6_2_ = (short)iVar13 * 0x40 + 0x40 +
                  ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) | pos._6_2_;
    }
    *(ushort *)(piVar17 + 3) = pos._6_2_;
    if (((ulong)uVar1 <= local_228 + lVar4) && (uVar15 != 0)) {
      in_RCX[3] = in_RCX[2];
      in_RCX[2] = in_RCX[1];
      in_RCX[1] = *in_RCX;
      *in_RCX = uVar1;
    }
    *(ulong *)params = local_1f8 + *(long *)params;
    local_1c8 = (ulong)uVar7 + local_1c8;
    local_1d8 = local_1d8 + 1;
  }
  *in_R8 = (in_RDI - local_1c8) + *in_R8;
  return;
}

Assistant:

void duckdb_brotli::BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = params->dictionary.compound.total_size;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}